

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

bool __thiscall CGlyphMap::SetFaceByName(CGlyphMap *this,FT_Face_conflict *pFace,char *pFamilyName)

{
  int iVar1;
  long in_RDX;
  long *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int i;
  FT_Face_conflict Face;
  char aFamilyStyleName [128];
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  int local_b4;
  long local_b0;
  char local_88 [112];
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = 0;
  if (in_RDX != 0) {
    for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0x450); local_b4 = local_b4 + 1) {
      str_format(local_88,0x80,"%s %s",
                 *(undefined8 *)(*(long *)(in_RDI + (long)local_b4 * 8 + 0x3d0) + 0x28),
                 *(undefined8 *)(*(long *)(in_RDI + (long)local_b4 * 8 + 0x3d0) + 0x30));
      iVar1 = str_comp(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38))
      ;
      if (iVar1 == 0) {
        local_b0 = *(long *)(in_RDI + (long)local_b4 * 8 + 0x3d0);
        break;
      }
      if ((local_b0 == 0) &&
         (iVar1 = str_comp(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff3f,
                                                   in_stack_ffffffffffffff38)), iVar1 == 0)) {
        local_b0 = *(long *)(in_RDI + (long)local_b4 * 8 + 0x3d0);
      }
    }
  }
  if (local_b0 != 0) {
    *in_RSI = local_b0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_b0 != 0;
}

Assistant:

bool CGlyphMap::SetFaceByName(FT_Face *pFace, const char *pFamilyName)
{
	FT_Face Face = NULL;
	char aFamilyStyleName[FONT_NAME_SIZE];

	if(pFamilyName != NULL)
	{
		for(int i = 0; i < m_NumFtFaces; ++i)
		{
			str_format(aFamilyStyleName, FONT_NAME_SIZE, "%s %s", m_aFtFaces[i]->family_name, m_aFtFaces[i]->style_name);
			if(str_comp(pFamilyName, aFamilyStyleName) == 0)
			{
				Face = m_aFtFaces[i];
				break;
			}

			if(!Face && str_comp(pFamilyName, m_aFtFaces[i]->family_name) == 0)
			{
				Face = m_aFtFaces[i];
			}
		}
	}

	if(Face)
	{
		*pFace = Face;
		return true;
	}
	return false;
}